

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *pWVar1;
  Index index;
  Var type_var;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::CallIndirect_Opcode);
  WritePuts(pWVar1,local_68.name,Space);
  if ((expr->table).field_2.index_ != 0 || (expr->table).type_ != Index) {
    WriteVar(this->writer_,&expr->table,Space);
  }
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"type",Space);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  if ((expr->decl).has_func_type == true) {
    Var::Var((Var *)&local_68,&(expr->decl).type_var);
  }
  else {
    index = Module::GetFuncTypeIndex((this->writer_->super_ModuleContext).module,&expr->decl);
    Var::Var((Var *)&local_68,index,&(expr->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc);
  }
  WriteVar(this->writer_,(Var *)&local_68,Newline);
  WriteClose(this->writer_,Newline);
  Var::~Var((Var *)&local_68);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table, NextChar::Space);
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}